

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddPolyline<ImVec2>
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ImVec2 IVar6;
  uint *puVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  bool bVar18;
  bool bVar19;
  uint uVar20;
  ulong uVar21;
  ImDrawVert *pIVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint *puVar27;
  uint uVar28;
  ulong uVar29;
  float fVar30;
  float fVar32;
  ImVec2 IVar31;
  float fVar33;
  float fVar34;
  float fVar36;
  ulong uVar35;
  float in_XMM4_Da;
  float in_XMM4_Db;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float d2;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float in_XMM15_Da;
  float fVar46;
  float in_XMM15_Db;
  int local_1c4;
  float local_e8;
  float fStack_e4;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  if (1 < points_count) {
    IVar6 = this->_Data->TexUvWhitePixel;
    uVar28 = points_count - 1;
    uVar10 = uVar28;
    if (closed) {
      uVar10 = points_count;
    }
    uVar4 = this->Flags;
    uVar25 = col & 0xffffff;
    uVar21 = (ulong)(uint)points_count;
    if (1.0 < thickness || (uVar4 & 1) == 0) {
      iVar2 = (uVar4 & 1) * 3 + 3;
      iVar16 = 9;
      if ((uVar4 & 1) != 0) {
        thickness = thickness + -1.0;
        iVar16 = 0x1b;
      }
      PrimReserve(this,iVar16 * uVar10,points_count * iVar2);
      fVar33 = thickness * 0.5;
      fVar36 = fVar33 + 1.0;
      if (closed) {
        in_XMM4_Da = (*points).x - points[uVar21 - 1].x;
        in_XMM4_Db = (*points).y - points[uVar21 - 1].y;
        fVar41 = in_XMM4_Da * in_XMM4_Da + in_XMM4_Db * in_XMM4_Db;
        if (0.0 < fVar41) {
          in_XMM4_Da = in_XMM4_Da * (1.0 / SQRT(fVar41));
          in_XMM4_Db = in_XMM4_Db * (1.0 / SQRT(fVar41));
        }
      }
      else {
        fVar41 = 0.0;
      }
      uVar5 = this->_VtxCurrentIdx;
      uVar1 = (uVar4 & 1) * 2 + 2;
      uVar13 = (ulong)uVar1;
      local_1c4 = 0;
      iVar16 = 0;
      for (uVar29 = 0; uVar21 != uVar29; uVar29 = uVar29 + 1) {
        uVar14 = 0;
        if (uVar21 - 1 != uVar29) {
          uVar14 = (ulong)((int)uVar29 + 1);
        }
        fVar32 = points[uVar29].x;
        fVar34 = points[uVar29].y;
        fVar39 = fVar32 - points[uVar14].x;
        fVar40 = fVar34 - points[uVar14].y;
        fVar42 = fVar39 * fVar39 + fVar40 * fVar40;
        if (0.0 < fVar42) {
          fVar39 = fVar39 * (1.0 / SQRT(fVar42));
          fVar40 = fVar40 * (1.0 / SQRT(fVar42));
        }
        fVar37 = fVar42;
        if (uVar29 == 0 && !closed) {
          in_XMM4_Da = -fVar39;
          in_XMM4_Db = -fVar40;
        }
        else {
          fVar42 = fVar41;
          if (uVar28 == uVar29 && !closed) {
            fVar39 = -in_XMM4_Da;
            fVar40 = -in_XMM4_Db;
            fVar37 = fVar41;
          }
        }
        fVar41 = fVar37;
        fVar45 = -in_XMM4_Db;
        fVar43 = in_XMM4_Da * fVar40 - fVar39 * in_XMM4_Db;
        fVar37 = in_XMM4_Da * fVar39 + fVar40 * in_XMM4_Db;
        if (ABS(fVar43) <= 1e-05) {
          uVar14 = CONCAT44(-in_XMM4_Da * fVar33 + fVar34,in_XMM4_Db * fVar33 + fVar32);
          fVar42 = fVar45 * fVar33 + fVar32;
          fVar38 = in_XMM4_Da * fVar33 + fVar34;
          if ((uVar4 & 1) != 0) {
            local_e8 = in_XMM4_Db * fVar36 + fVar32;
            fStack_e4 = -in_XMM4_Da * fVar36 + fVar34;
            in_XMM15_Da = fVar45 * fVar36 + fVar32;
            in_XMM15_Db = in_XMM4_Da * fVar36 + fVar34;
          }
        }
        else {
          fVar38 = fVar33 / fVar43;
          if (1e-05 < fVar37) {
            fVar30 = fVar41;
            if (fVar42 <= fVar41) {
              fVar30 = fVar42;
            }
            fVar42 = ((fVar39 + in_XMM4_Da) * (fVar39 + in_XMM4_Da) +
                     (fVar40 + in_XMM4_Db) * (fVar40 + in_XMM4_Db)) * fVar38 * fVar38;
            if (fVar30 < fVar42) {
              fVar30 = fVar30 / fVar42;
              if (fVar30 < 0.0) {
                fVar30 = sqrtf(fVar30);
              }
              else {
                fVar30 = SQRT(fVar30);
              }
              fVar38 = fVar38 * fVar30;
              fVar32 = points[uVar29].x;
              fVar34 = points[uVar29].y;
            }
          }
          fVar44 = fVar40 + in_XMM4_Db;
          fVar30 = fVar39 + in_XMM4_Da;
          uVar14 = CONCAT44(fVar34 - fVar38 * fVar44,fVar32 - fVar38 * fVar30);
          fVar42 = fVar38 * fVar30 + fVar32;
          fVar38 = fVar38 * fVar44 + fVar34;
          if ((uVar4 & 1) != 0) {
            fVar46 = fVar36 / fVar43;
            local_e8 = -fVar30 * fVar46 + fVar32;
            fStack_e4 = -fVar44 * fVar46 + fVar34;
            in_XMM15_Da = fVar46 * fVar30 + fVar32;
            in_XMM15_Db = fVar46 * fVar44 + fVar34;
          }
        }
        iVar11 = ((fVar43 < 0.0) - 1) + (uint)(fVar43 < 0.0);
        uVar15 = uVar13;
        if (1e-05 < fVar37) {
          fVar30 = (float)-iVar11;
          fVar43 = fVar45 * fVar30 + in_XMM4_Da;
          in_XMM4_Db = in_XMM4_Da * fVar30 + in_XMM4_Db;
          local_48 = fVar43 * fVar33 + fVar32;
          fStack_44 = in_XMM4_Db * fVar33 + fVar34;
          fVar45 = fVar40 * fVar30 + fVar39;
          fVar30 = -fVar39 * fVar30 + fVar40;
          local_58 = fVar45 * fVar33 + fVar32;
          fStack_54 = fVar30 * fVar33 + fVar34;
          if ((uVar4 & 1) == 0) {
            uVar15 = 3;
          }
          else {
            local_68 = fVar43 * fVar36 + fVar32;
            fStack_64 = in_XMM4_Db * fVar36 + fVar34;
            local_78 = fVar45 * fVar36 + fVar32;
            fStack_74 = fVar30 * fVar36 + fVar34;
            uVar15 = 6;
          }
        }
        in_XMM4_Da = -fVar39;
        bVar19 = 0 < iVar11 && 1e-05 < fVar37;
        bVar18 = iVar11 < 0 && 1e-05 < fVar37;
        pIVar22 = this->_VtxWritePtr;
        uVar26 = (uint)bVar19;
        uVar35 = CONCAT44((int)(uVar26 << 0x1f) >> 0x1f,(int)(uVar26 << 0x1f) >> 0x1f);
        pIVar22->pos = (ImVec2)(~uVar35 & uVar14 | CONCAT44(fStack_44,local_48) & uVar35);
        pIVar22->uv = IVar6;
        pIVar22 = this->_VtxWritePtr;
        pIVar22->col = col;
        uVar17 = (uint)bVar18;
        uVar14 = CONCAT44((int)(uVar17 << 0x1f) >> 0x1f,(int)(uVar17 << 0x1f) >> 0x1f);
        pIVar22[1].pos =
             (ImVec2)(~uVar14 & CONCAT44(fVar38,fVar42) | CONCAT44(fStack_44,local_48) & uVar14);
        pIVar22[1].uv = IVar6;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[1].col = col;
        if (1e-05 < fVar37) {
          IVar9.y = fStack_54;
          IVar9.x = local_58;
          pIVar22[uVar13].pos = IVar9;
          pIVar22[uVar13].uv = IVar6;
          pIVar22 = this->_VtxWritePtr;
          pIVar22[uVar13].col = col;
        }
        if ((uVar4 & 1) != 0) {
          uVar14 = CONCAT44((int)(uVar26 << 0x1f) >> 0x1f,(int)(uVar26 << 0x1f) >> 0x1f);
          pIVar22[2].pos =
               (ImVec2)(~uVar14 & CONCAT44(fStack_e4,local_e8) |
                       CONCAT44(fStack_64,local_68) & uVar14);
          pIVar22[2].uv = IVar6;
          pIVar22 = this->_VtxWritePtr;
          pIVar22[2].col = uVar25;
          uVar14 = CONCAT44((int)(uVar17 << 0x1f) >> 0x1f,(int)(uVar17 << 0x1f) >> 0x1f);
          pIVar22[3].pos =
               (ImVec2)(~uVar14 & CONCAT44(in_XMM15_Db,in_XMM15_Da) |
                       CONCAT44(fStack_64,local_68) & uVar14);
          pIVar22[3].uv = IVar6;
          pIVar22 = this->_VtxWritePtr;
          pIVar22[3].col = uVar25;
          if (1e-05 < fVar37) {
            IVar8.y = fStack_74;
            IVar8.x = local_78;
            pIVar22[5].pos = IVar8;
            pIVar22[5].uv = IVar6;
            pIVar22 = this->_VtxWritePtr;
            pIVar22[5].col = uVar25;
          }
        }
        iVar12 = (int)uVar15;
        this->_VtxWritePtr = pIVar22 + uVar15;
        if (uVar29 < uVar10) {
          uVar17 = this->_VtxCurrentIdx;
          uVar26 = iVar12 + uVar17;
          if (uVar28 <= uVar29) {
            uVar26 = uVar5;
          }
          uVar23 = 0;
          if (0 < iVar11 && 1e-05 < fVar37) {
            uVar23 = uVar1;
          }
          uVar23 = uVar23 + uVar17;
          uVar20 = 1;
          if (iVar11 < 0 && 1e-05 < fVar37) {
            uVar20 = uVar1;
          }
          uVar20 = uVar20 + uVar17;
          uVar24 = uVar26 + 1;
          puVar7 = this->_IdxWritePtr;
          puVar27 = puVar7 + 6;
          *puVar7 = uVar23;
          puVar7[1] = uVar20;
          puVar7[2] = uVar24;
          puVar7[3] = uVar23;
          puVar7[4] = uVar24;
          puVar7[5] = uVar26;
          this->_IdxWritePtr = puVar27;
          if (fVar37 <= 1e-05) {
            local_1c4 = local_1c4 + 3;
          }
          else {
            puVar7[6] = uVar23;
            puVar7[7] = uVar20;
            puVar7[8] = uVar17 - (~-iVar11 >> 0x1f);
            puVar27 = puVar7 + 9;
            this->_IdxWritePtr = puVar27;
          }
          if ((uVar4 & 1) != 0) {
            uVar17 = this->_VtxCurrentIdx + 2 + (uint)bVar19 + (uint)bVar19 * 2;
            uVar3 = this->_VtxCurrentIdx + 3 + (uint)bVar18 * 2;
            *puVar27 = uVar17;
            puVar27[1] = uVar23;
            puVar27[2] = uVar26;
            puVar27[3] = uVar17;
            puVar27[4] = uVar26;
            puVar27[5] = uVar26 + 2;
            puVar27[6] = uVar3;
            puVar27[7] = uVar20;
            puVar27[8] = uVar24;
            puVar27[9] = uVar3;
            puVar27[10] = uVar24;
            puVar27[0xb] = uVar26 + 3;
            this->_IdxWritePtr = puVar27 + 0xc;
            if (fVar37 <= 1e-05) {
              local_1c4 = local_1c4 + 6;
            }
            else {
              bVar18 = iVar11 < 0;
              iVar11 = 2 - (uint)bVar18;
              puVar27[0xc] = this->_VtxCurrentIdx + iVar11;
              puVar27[0xd] = (uint)bVar18 * 3 + this->_VtxCurrentIdx;
              puVar27[0xe] = this->_VtxCurrentIdx + bVar18 + 4;
              puVar27[0xf] = iVar11 + this->_VtxCurrentIdx;
              puVar27[0x10] = bVar18 + 4 + this->_VtxCurrentIdx;
              puVar27[0x11] = (bVar18 ^ 5) + this->_VtxCurrentIdx;
              this->_IdxWritePtr = puVar27 + 0x12;
            }
          }
        }
        iVar16 = (iVar16 + iVar2) - iVar12;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + iVar12;
        in_XMM4_Db = -fVar40;
      }
      PrimUnreserve(this,local_1c4,iVar16);
      return;
    }
    PrimReserve(this,uVar10 * 0xc,uVar10 * 6);
    uVar28 = (int)((float)(col >> 0x18) * thickness) << 0x18 | uVar25;
    for (uVar13 = 1; uVar13 - uVar10 != 1; uVar13 = uVar13 + 1) {
      uVar29 = uVar13 & 0xffffffff;
      if (uVar21 == uVar13) {
        uVar29 = 0;
      }
      fVar41 = points[uVar13 - 1].x;
      fVar33 = points[uVar29].x - fVar41;
      fVar32 = points[uVar13 - 1].y;
      fVar36 = points[uVar29].y - fVar32;
      fVar34 = fVar33 * fVar33 + fVar36 * fVar36;
      if (0.0 < fVar34) {
        fVar34 = 1.0 / SQRT(fVar34);
        fVar36 = fVar36 * fVar34;
        fVar33 = fVar33 * fVar34;
      }
      IVar31.y = fVar32 - fVar33;
      IVar31.x = fVar41 + fVar36;
      pIVar22 = this->_VtxWritePtr;
      pIVar22->pos = IVar31;
      pIVar22->uv = IVar6;
      pIVar22 = this->_VtxWritePtr;
      pIVar22->col = uVar25;
      pIVar22[1].pos = points[uVar13 - 1];
      pIVar22[1].uv = IVar6;
      pIVar22 = this->_VtxWritePtr;
      pIVar22[1].col = uVar28;
      pIVar22[2].pos.x = points[uVar13 - 1].x - fVar36;
      pIVar22[2].pos.y = points[uVar13 - 1].y + fVar33;
      pIVar22[2].uv = IVar6;
      pIVar22 = this->_VtxWritePtr;
      pIVar22[2].col = uVar25;
      pIVar22[3].pos.x = points[uVar29].x + fVar36;
      pIVar22[3].pos.y = points[uVar29].y - fVar33;
      pIVar22[3].uv = IVar6;
      pIVar22 = this->_VtxWritePtr;
      pIVar22[3].col = uVar25;
      pIVar22[4].pos = points[uVar29];
      pIVar22[4].uv = IVar6;
      pIVar22 = this->_VtxWritePtr;
      pIVar22[4].col = uVar28;
      pIVar22[5].pos.x = points[uVar29].x - fVar36;
      pIVar22[5].pos.y = points[uVar29].y + fVar33;
      pIVar22[5].uv = IVar6;
      pIVar22 = this->_VtxWritePtr;
      pIVar22[5].col = uVar25;
      this->_VtxWritePtr = pIVar22 + 6;
      uVar4 = this->_VtxCurrentIdx;
      puVar27 = this->_IdxWritePtr;
      *puVar27 = uVar4;
      puVar27[1] = uVar4 + 1;
      puVar27[2] = this->_VtxCurrentIdx + 4;
      uVar4 = this->_VtxCurrentIdx;
      puVar27[3] = uVar4;
      puVar27[4] = uVar4 + 4;
      puVar27[5] = this->_VtxCurrentIdx + 3;
      puVar27[6] = this->_VtxCurrentIdx + 1;
      puVar27[7] = this->_VtxCurrentIdx + 2;
      puVar27[8] = this->_VtxCurrentIdx + 5;
      puVar27[9] = this->_VtxCurrentIdx + 1;
      puVar27[10] = this->_VtxCurrentIdx + 5;
      puVar27[0xb] = this->_VtxCurrentIdx + 4;
      this->_IdxWritePtr = puVar27 + 0xc;
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + 6;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const Vec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count; // segment count
    if (!closed)
        count = points_count -1 ;

    const bool antialias = Flags & ImDrawListFlags_AntiAliasedLines;
    const float AA_SIZE = 1.0f;
    const ImU32 col_trans = col & ~IM_COL32_A_MASK;

    if (antialias && thickness <= 1.0f)
    {
        // Anti-aliased stroke approximation
        const int idx_count = count*12;
        const int vtx_count = count*6;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);
        const ImU32 col_faded = (col & ~IM_COL32_A_MASK) | ((int)(((col >> IM_COL32_A_SHIFT) & 0xFF) * thickness) << IM_COL32_A_SHIFT);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const Vec2& p1 = points[i1];
            const Vec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= AA_SIZE;
            dy *= AA_SIZE;

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
            _VtxWritePtr[1].pos.x = p1.x     ; _VtxWritePtr[1].pos.y = p1.y     ; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_faded;
            _VtxWritePtr[2].pos.x = p1.x - dy; _VtxWritePtr[2].pos.y = p1.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;

            _VtxWritePtr[3].pos.x = p2.x + dy; _VtxWritePtr[3].pos.y = p2.y - dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
            _VtxWritePtr[4].pos.x = p2.x     ; _VtxWritePtr[4].pos.y = p2.y     ; _VtxWritePtr[4].uv = uv; _VtxWritePtr[4].col = col_faded;
            _VtxWritePtr[5].pos.x = p2.x - dy; _VtxWritePtr[5].pos.y = p2.y + dx; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
            _VtxWritePtr += 6;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+4); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr[6] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[7] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[8] = (ImDrawIdx)(_VtxCurrentIdx+5);
            _IdxWritePtr[9] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[10] = (ImDrawIdx)(_VtxCurrentIdx+5); _IdxWritePtr[11] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr += 12;
            _VtxCurrentIdx += 6;
        }
    }
    else
    {
        // Precise line with bevels on acute angles
        const int max_n_vtx = antialias ? 6 : 3;
        const int max_n_idx = 3 * (antialias ? 9 : 3);
        const int vtx_count = points_count * max_n_vtx;
        const int idx_count = count * max_n_idx;
        PrimReserve(idx_count, vtx_count);

        const float half_thickness = (antialias ? thickness - AA_SIZE : thickness) * 0.5f;
        const float half_thickness_aa = half_thickness + AA_SIZE;
        unsigned int first_vtx_ptr = _VtxCurrentIdx;
        unsigned int unused_vertices = 0;
        unsigned int unused_indices = 0;

        float sqlen1 = 0.0f;
        float dx1, dy1;
        if (closed)
        {
            dx1 = points[0].x - points[points_count-1].x;
            dy1 = points[0].y - points[points_count-1].y;
            sqlen1 = dx1 * dx1 + dy1 * dy1;
            IM_NORMALIZE2F_OVER_ZERO(dx1, dy1);
        }

        for (int i1 = 0; i1 < points_count; i1++)
        {
            const Vec2& p1 = points[i1];
            const int i2 = (i1 + 1 == points_count) ? 0 : i1 + 1;
            const Vec2& p2 = points[i2];
            float dx2 = p1.x - p2.x;
            float dy2 = p1.y - p2.y;
            float sqlen2 = dx2 * dx2 + dy2 * dy2;
            IM_NORMALIZE2F_OVER_ZERO(dx2, dy2);

            if (!closed && i1 == 0)
            {
                dx1 = -dx2;
                dy1 = -dy2;
                sqlen1 = sqlen2;
            }
            else if (!closed && i1 == points_count-1)
            {
                dx2 = -dx1;
                dy2 = -dy1;
                sqlen2 = sqlen1;
            }

            float miter_l_recip = dx1 * dy2 - dy1 * dx2;
            float mlx, mly, mrx, mry;     // Left and right miters
            float mlax, mlay, mrax, mray; // Left and right miters including anti-aliasing
            const bool bevel = (dx1 * dx2 + dy1 * dy2) > 1e-5f;
            if (ImFabs(miter_l_recip) > 1e-5f)
            {
                float miter_l = half_thickness / miter_l_recip;
                // Limit (inner) miter so it doesn't shoot away when miter is longer than adjacent line segments on acute angles
                if (bevel)
                {
                    // This is too aggressive (not exactly precise)
                    float min_sqlen = sqlen1 > sqlen2 ? sqlen2 : sqlen1;
                    float miter_sqlen = ((dx1 + dx2) * (dx1 + dx2) + (dy1 + dy2) * (dy1 + dy2)) * miter_l * miter_l;
                    if (miter_sqlen > min_sqlen)
                        miter_l *= ImSqrt(min_sqlen / miter_sqlen);
                }
                mlx = p1.x - (dx1 + dx2) * miter_l;
                mly = p1.y - (dy1 + dy2) * miter_l;
                mrx = p1.x + (dx1 + dx2) * miter_l;
                mry = p1.y + (dy1 + dy2) * miter_l;
                if (antialias)
                {
                    float miter_al = half_thickness_aa / miter_l_recip;
                    mlax = p1.x - (dx1 + dx2) * miter_al;
                    mlay = p1.y - (dy1 + dy2) * miter_al;
                    mrax = p1.x + (dx1 + dx2) * miter_al;
                    mray = p1.y + (dy1 + dy2) * miter_al;
                }
            }
            else
            {
                // Avoid degeneracy for (nearly) straight lines
                mlx = p1.x + dy1 * half_thickness;
                mly = p1.y - dx1 * half_thickness;
                mrx = p1.x - dy1 * half_thickness;
                mry = p1.y + dx1 * half_thickness;
                if (antialias)
                {
                    mlax = p1.x + dy1 * half_thickness_aa;
                    mlay = p1.y - dx1 * half_thickness_aa;
                    mrax = p1.x - dy1 * half_thickness_aa;
                    mray = p1.y + dx1 * half_thickness_aa;
                }
            }
            // The two bevel vertices if the angle is right or obtuse
            // miter_sign == 1, iff the outer (maybe bevelled) edge is on the right, -1 iff it is on the left
            int miter_sign = (miter_l_recip >= 0) - (miter_l_recip < 0);
            float b1x, b1y, b2x, b2y;     // First and second bevel point
            float b1ax, b1ay, b2ax, b2ay; // First and second bevel point including anti-aliasing
            if (bevel)
            {
                // FIXME-OPT: benchmark if doing these computations only once in AA case saves cycles
                b1x = p1.x + (dx1 - dy1 * miter_sign) * half_thickness;
                b1y = p1.y + (dy1 + dx1 * miter_sign) * half_thickness;
                b2x = p1.x + (dx2 + dy2 * miter_sign) * half_thickness;
                b2y = p1.y + (dy2 - dx2 * miter_sign) * half_thickness;
                if (antialias)
                {
                    b1ax = p1.x + (dx1 - dy1 * miter_sign) * half_thickness_aa;
                    b1ay = p1.y + (dy1 + dx1 * miter_sign) * half_thickness_aa;
                    b2ax = p1.x + (dx2 + dy2 * miter_sign) * half_thickness_aa;
                    b2ay = p1.y + (dy2 - dx2 * miter_sign) * half_thickness_aa;
                }
            }

            // Set the previous line direction so it doesn't need to be recomputed
            dx1 = -dx2;
            dy1 = -dy2;
            sqlen1 = sqlen2;

            // Now that we have all the point coordinates, put them into buffers

            // Vertices for each point are ordered in vertex buffer like this (looking in the direction of the polyline):
            // - left vertex*
            // - right vertex*
            // - left vertex AA fringe*  (if antialias)
            // - right vertex AA fringe* (if antialias)
            // - the remaining vertex (if bevel)
            // - the remaining vertex AA fringe (if bevel and antialias)
            // (*) if there is bevel, these vertices are the ones on the incoming edge.
            // Having all the vertices of the incoming edge in predictable positions is important - we reference them
            // even if we don't know relevant line properties yet

            int vertex_count = antialias ? (bevel ? 6 : 4) : (bevel ? 3 : 2); // FIXME: shorten the expression
            unsigned int bi = antialias ? 4 : 2; // Outgoing edge bevel vertex index
            const bool bevel_l = bevel && miter_sign < 0;
            const bool bevel_r = bevel && miter_sign > 0;

            _VtxWritePtr[0].pos.x = bevel_l ? b1x : mlx; _VtxWritePtr[0].pos.y = bevel_l ? b1y : mly; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = bevel_r ? b1x : mrx; _VtxWritePtr[1].pos.y = bevel_r ? b1y : mry; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            if (bevel)
            {
                _VtxWritePtr[bi].pos.x = b2x; _VtxWritePtr[bi].pos.y = b2y; _VtxWritePtr[bi].uv = uv; _VtxWritePtr[bi].col = col;
            }

            if (antialias)
            {
                _VtxWritePtr[2].pos.x = bevel_l ? b1ax : mlax; _VtxWritePtr[2].pos.y = bevel_l ? b1ay : mlay; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr[3].pos.x = bevel_r ? b1ax : mrax; _VtxWritePtr[3].pos.y = bevel_r ? b1ay : mray; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                if (bevel)
                {
                    _VtxWritePtr[5].pos.x = b2ax; _VtxWritePtr[5].pos.y = b2ay; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
                }
            }
            unused_vertices += max_n_vtx - vertex_count;
            _VtxWritePtr += vertex_count;

            if (i1 < count)
            {
                const int vtx_next_id = i1 < points_count-1 ? _VtxCurrentIdx+vertex_count : first_vtx_ptr;
                unsigned int l1i = _VtxCurrentIdx + (bevel_l ? bi : 0);
                unsigned int r1i = _VtxCurrentIdx + (bevel_r ? bi : 1);
                unsigned int l2i = vtx_next_id;
                unsigned int r2i = vtx_next_id + 1;
                unsigned int ebi = _VtxCurrentIdx + (bevel_l ? 0 : 1); // incoming edge bevel vertex index

                _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)r2i;
                _IdxWritePtr[3] = (ImDrawIdx)l1i; _IdxWritePtr[4] = (ImDrawIdx)r2i; _IdxWritePtr[5] = (ImDrawIdx)l2i;
                _IdxWritePtr += 6;

                if (bevel)
                {
                    _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)ebi;
                    _IdxWritePtr += 3;
                }
                else
                    unused_indices += 3;

                if (antialias)
                {
                    unsigned int l1ai = _VtxCurrentIdx + (bevel_l ? 5 : 2);
                    unsigned int r1ai = _VtxCurrentIdx + (bevel_r ? 5 : 3);
                    unsigned int l2ai = vtx_next_id + 2;
                    unsigned int r2ai = vtx_next_id + 3;

                    _IdxWritePtr[0] = (ImDrawIdx)l1ai; _IdxWritePtr[1]  = (ImDrawIdx)l1i; _IdxWritePtr[2]  = (ImDrawIdx)l2i;
                    _IdxWritePtr[3] = (ImDrawIdx)l1ai; _IdxWritePtr[4]  = (ImDrawIdx)l2i; _IdxWritePtr[5]  = (ImDrawIdx)l2ai;
                    _IdxWritePtr[6] = (ImDrawIdx)r1ai; _IdxWritePtr[7]  = (ImDrawIdx)r1i; _IdxWritePtr[8]  = (ImDrawIdx)r2i;
                    _IdxWritePtr[9] = (ImDrawIdx)r1ai; _IdxWritePtr[10] = (ImDrawIdx)r2i; _IdxWritePtr[11] = (ImDrawIdx)r2ai;
                    _IdxWritePtr += 12;

                    if (bevel)
                    {
                        _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 3 : 0));
                        _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));

                        _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));
                        _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 4 : 5));
                        _IdxWritePtr += 6;
                    }
                    else
                    {
                        unused_indices += 6;
                    }
                }
            }
            _VtxCurrentIdx += vertex_count;
        }
        PrimUnreserve((int)unused_indices, (int)unused_vertices);
    }
}